

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

bool ModulusSimpleCaseHelper<signed_char,_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
     ::ModulusSimpleCase(char lhs,
                        SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        rhs,SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                            *result)

{
  bool bVar1;
  
  if (rhs.m_int != '\0') {
    bVar1 = ModulusSignedCaseHelper<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
            ::SignedCase(rhs,result);
    if (!bVar1) {
      result->m_int =
           (char)(CONCAT22(CONCAT11(lhs >> 7,lhs >> 7),(short)lhs) % (int)(short)rhs.m_int);
    }
    return true;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnDivZero();
}

Assistant:

static bool ModulusSimpleCase( U lhs, SafeInt< T, E > rhs, SafeInt< T, E >& result ) SAFEINT_CPP_THROW
    {
        if( rhs != 0 )
        {
            if( ModulusSignedCaseHelper< T, E, std::numeric_limits< T >::is_signed >::SignedCase( rhs, result ) )
            return true;

            result = (T)( lhs % (T)rhs );
            return true;
        }

        E::SafeIntOnDivZero();
    }